

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_3x3_pack4.h
# Opt level: O1

void ncnn::pooling3x3s2_max_pack4_sse(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  undefined1 (*pauVar9) [16];
  int iVar10;
  long lVar11;
  long lVar12;
  undefined1 (*pauVar13) [16];
  int iVar14;
  long lVar15;
  undefined1 (*pauVar16) [16];
  undefined1 (*pauVar17) [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  iVar3 = bottom_blob->c;
  if (0 < (long)iVar3) {
    uVar4 = top_blob->w;
    iVar5 = top_blob->h;
    lVar11 = (long)(int)((bottom_blob->w - uVar4) * 8);
    lVar12 = 0;
    do {
      if (0 < iVar5) {
        pauVar13 = (undefined1 (*) [16])
                   (top_blob->cstep * lVar12 * top_blob->elemsize + (long)top_blob->data);
        pauVar16 = (undefined1 (*) [16])
                   (bottom_blob->cstep * lVar12 * bottom_blob->elemsize + (long)bottom_blob->data);
        lVar8 = (long)bottom_blob->w * bottom_blob->elemsize;
        pauVar17 = (undefined1 (*) [16])(*pauVar16 + lVar8 * 2);
        pauVar9 = (undefined1 (*) [16])(*pauVar16 + lVar8);
        iVar10 = 0;
        do {
          if ((int)uVar4 < 2) {
            uVar6 = 0;
          }
          else {
            iVar14 = 1;
            do {
              auVar19 = maxps(pauVar16[1],*pauVar16);
              auVar18 = pauVar16[2];
              pauVar1 = pauVar16 + 3;
              auVar20 = pauVar9[2];
              auVar24 = pauVar9[3];
              auVar21 = maxps(*pauVar9,auVar18);
              auVar19 = maxps(auVar21,auVar19);
              auVar22 = maxps(auVar19,pauVar9[1]);
              auVar19 = pauVar17[2];
              auVar21 = pauVar17[3];
              auVar23 = maxps(*pauVar17,auVar20);
              auVar25 = maxps(pauVar17[1],auVar19);
              auVar23 = maxps(auVar25,auVar23);
              auVar25 = maxps(auVar23,auVar22);
              pauVar2 = pauVar16 + 4;
              pauVar16 = pauVar16 + 4;
              auVar22 = maxps(*pauVar2,*pauVar1);
              pauVar1 = pauVar9 + 4;
              pauVar9 = pauVar9 + 4;
              pauVar2 = pauVar17 + 4;
              pauVar17 = pauVar17 + 4;
              auVar23 = maxps(*pauVar2,*pauVar1);
              *pauVar13 = auVar25;
              auVar18 = maxps(auVar24,auVar18);
              auVar18 = maxps(auVar18,auVar22);
              auVar20 = maxps(auVar21,auVar20);
              auVar24 = maxps(auVar23,auVar19);
              auVar18 = maxps(auVar24,auVar18);
              auVar18 = maxps(auVar18,auVar20);
              pauVar13[1] = auVar18;
              pauVar13 = pauVar13 + 2;
              iVar14 = iVar14 + 2;
              uVar6 = uVar4 & 0xfffffffe;
            } while (iVar14 < (int)uVar4);
          }
          iVar14 = uVar4 - uVar6;
          if (iVar14 != 0 && (int)uVar6 <= (int)uVar4) {
            lVar15 = 0;
            lVar8 = 0;
            do {
              lVar7 = lVar8;
              auVar18 = maxps(*(undefined1 (*) [16])(pauVar16[1] + lVar7 * 2),
                              *(undefined1 (*) [16])(*pauVar16 + lVar7 * 2));
              auVar20 = maxps(*(undefined1 (*) [16])(*pauVar9 + lVar7 * 2),
                              *(undefined1 (*) [16])(pauVar16[2] + lVar7 * 2));
              auVar18 = maxps(auVar20,auVar18);
              auVar18 = maxps(*(undefined1 (*) [16])(pauVar9[1] + lVar7 * 2),auVar18);
              auVar20 = maxps(*(undefined1 (*) [16])(*pauVar17 + lVar7 * 2),
                              *(undefined1 (*) [16])(pauVar9[2] + lVar7 * 2));
              auVar24 = maxps(*(undefined1 (*) [16])(pauVar17[2] + lVar7 * 2),
                              *(undefined1 (*) [16])(pauVar17[1] + lVar7 * 2));
              auVar20 = maxps(auVar24,auVar20);
              auVar18 = maxps(auVar20,auVar18);
              *(undefined1 (*) [16])((long)*pauVar13 + lVar7) = auVar18;
              lVar15 = lVar15 + -0x20;
              iVar14 = iVar14 + -1;
              lVar8 = lVar7 + 0x10;
            } while (iVar14 != 0);
            pauVar13 = (undefined1 (*) [16])(pauVar13[1] + lVar7);
            pauVar16 = (undefined1 (*) [16])((long)pauVar16 - lVar15);
            pauVar9 = (undefined1 (*) [16])((long)pauVar9 - lVar15);
            pauVar17 = (undefined1 (*) [16])((long)pauVar17 - lVar15);
          }
          pauVar16 = (undefined1 (*) [16])(*pauVar16 + lVar11 * 4);
          pauVar9 = (undefined1 (*) [16])(*pauVar9 + lVar11 * 4);
          pauVar17 = (undefined1 (*) [16])(*pauVar17 + lVar11 * 4);
          iVar10 = iVar10 + 1;
        } while (iVar10 != iVar5);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != iVar3);
  }
  return;
}

Assistant:

static void pooling3x3s2_max_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 4;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        for (int i = 0; i < outh; i++)
        {
            int j = 0;
            for (; j + 1 < outw; j += 2)
            {
                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                __m128 _max00 = _mm_max_ps(_r00, _r01);
                _max00 = _mm_max_ps(_max00, _r02);
                _max00 = _mm_max_ps(_max00, _r10);
                _max00 = _mm_max_ps(_max00, _r11);
                __m128 _max01 = _mm_max_ps(_r12, _r20);
                _max01 = _mm_max_ps(_max01, _r21);
                _max01 = _mm_max_ps(_max01, _r22);

                __m128 _r03 = _mm_loadu_ps(r0 + 12);
                __m128 _r04 = _mm_loadu_ps(r0 + 16);
                __m128 _r13 = _mm_loadu_ps(r1 + 12);
                __m128 _r14 = _mm_loadu_ps(r1 + 16);
                __m128 _r23 = _mm_loadu_ps(r2 + 12);
                __m128 _r24 = _mm_loadu_ps(r2 + 16);

                _mm_storeu_ps(outptr, _mm_max_ps(_max00, _max01));

                __m128 _max10 = _mm_max_ps(_r03, _r04);
                _max10 = _mm_max_ps(_max10, _r02);
                _max10 = _mm_max_ps(_max10, _r13);
                _max10 = _mm_max_ps(_max10, _r14);
                __m128 _max11 = _mm_max_ps(_r12, _r23);
                _max10 = _mm_max_ps(_max10, _r24);
                _max10 = _mm_max_ps(_max10, _r22);

                _mm_storeu_ps(outptr + 4, _mm_max_ps(_max10, _max11));

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr += 8;
            }

            for (; j < outw; j++)
            {
                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                __m128 _max0 = _mm_max_ps(_r00, _r01);
                _max0 = _mm_max_ps(_max0, _r02);
                _max0 = _mm_max_ps(_max0, _r10);
                _max0 = _mm_max_ps(_max0, _r11);
                __m128 _max1 = _mm_max_ps(_r12, _r20);
                _max1 = _mm_max_ps(_max1, _r21);
                _max1 = _mm_max_ps(_max1, _r22);

                _mm_storeu_ps(outptr, _mm_max_ps(_max0, _max1));

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr += 4;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}